

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O1

void vk::BinaryRegistryDetail::BinaryIndexHashImpl_delete
               (BinaryIndexHashImpl *hash,ProgramBinary *key)

{
  bool bVar1;
  deUint32 dVar2;
  deBool dVar3;
  BinaryIndexHashImplSlot *pBVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  BinaryIndexHashImplSlot **ppBVar8;
  size_t numBytes;
  BinaryIndexHashImplSlot *pBVar9;
  BinaryIndexHashImplSlot *pBVar10;
  BinaryIndexHashImplSlot *pBVar11;
  long lVar12;
  
  pBVar9 = (BinaryIndexHashImplSlot *)
           (key->m_binary).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  pBVar4 = (BinaryIndexHashImplSlot *)0x0;
  numBytes = (long)(key->m_binary).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar9;
  if (numBytes == 0) {
    pBVar9 = pBVar4;
  }
  dVar2 = deMemoryHash(pBVar9,numBytes);
  uVar5 = hash->slotTableSize - 1U & dVar2;
  pBVar9 = hash->slotTable[(int)uVar5];
  do {
    bVar1 = 0 < pBVar9->numUsed;
    if (pBVar9->numUsed < 1) {
LAB_00a2ff74:
      pBVar10 = pBVar9->nextSlot;
      pBVar4 = pBVar9;
    }
    else {
      dVar3 = anon_unknown_8::binaryEqual(pBVar9->keys[0],key);
      if (dVar3 == 0) {
        lVar6 = 0;
        do {
          lVar12 = lVar6 + 1;
          bVar1 = lVar12 < pBVar9->numUsed;
          if (pBVar9->numUsed <= lVar12) goto LAB_00a2ff74;
          dVar3 = anon_unknown_8::binaryEqual(pBVar9->keys[lVar6 + 1],key);
          lVar6 = lVar12;
          pBVar10 = pBVar9;
        } while (dVar3 == 0);
      }
      else {
        lVar12 = 0;
        pBVar10 = pBVar9;
      }
      do {
        pBVar11 = pBVar4;
        pBVar4 = pBVar10;
        pBVar10 = pBVar4->nextSlot;
      } while (pBVar4->nextSlot != (BinaryIndexHashImplSlot *)0x0);
      iVar7 = pBVar4->numUsed + -1;
      pBVar9->keys[lVar12] = pBVar4->keys[iVar7];
      pBVar9->values[lVar12] = pBVar4->values[iVar7];
      pBVar4->numUsed = pBVar4->numUsed + -1;
      if (pBVar4->numUsed == 0) {
        if (pBVar11 == (BinaryIndexHashImplSlot *)0x0) {
          ppBVar8 = hash->slotTable + (int)uVar5;
        }
        else {
          ppBVar8 = &pBVar11->nextSlot;
        }
        *ppBVar8 = (BinaryIndexHashImplSlot *)0x0;
        pBVar4->nextSlot = hash->slotFreeList;
        hash->slotFreeList = pBVar4;
      }
      hash->numElements = hash->numElements + -1;
      pBVar4 = pBVar11;
      pBVar10 = pBVar9;
    }
    pBVar9 = pBVar10;
    if (bVar1) {
      return;
    }
  } while( true );
}

Assistant:

BinaryIndexHash::BinaryIndexHash (void)
	: m_hash(BinaryIndexHashImpl_create(m_memPool.getRawPool()))
{
	if (!m_hash)
		throw std::bad_alloc();
}